

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_tracing_register_cb_libapi.cpp
# Opt level: O2

ze_result_t
zelTracerCommandListAppendMemoryRangesBarrierRegisterCallback
          (zel_tracer_handle_t hTracer,zel_tracer_reg_t callback_type,
          ze_pfnCommandListAppendMemoryRangesBarrierCb_t pfnAppendMemoryRangesBarrierCb)

{
  ze_result_t zVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  if (*(long *)(ze_lib::context + 0xd88) != 0) {
    UNRECOVERED_JUMPTABLE =
         (code *)dlsym(*(long *)(ze_lib::context + 0xd88),
                       "zelTracerCommandListAppendMemoryRangesBarrierRegisterCallback");
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)(hTracer,callback_type,pfnAppendMemoryRangesBarrierCb);
      return zVar1;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_APIEXPORT ze_result_t ZE_APICALL
zelTracerCommandListAppendMemoryRangesBarrierRegisterCallback(
    zel_tracer_handle_t hTracer,
    zel_tracer_reg_t callback_type,
    ze_pfnCommandListAppendMemoryRangesBarrierCb_t pfnAppendMemoryRangesBarrierCb
    ) {

    if(!ze_lib::context->tracing_lib)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    typedef ze_result_t (ZE_APICALL *ze_pfnSetCallback_t)(
        zel_tracer_handle_t hTracer,
        zel_tracer_reg_t callback_type,
        ze_pfnCommandListAppendMemoryRangesBarrierCb_t pfnAppendMemoryRangesBarrierCb
    );

    auto func = reinterpret_cast<ze_pfnSetCallback_t>(
        GET_FUNCTION_PTR(ze_lib::context->tracing_lib, "zelTracerCommandListAppendMemoryRangesBarrierRegisterCallback") );

    if(func)
        return func(hTracer, callback_type, pfnAppendMemoryRangesBarrierCb);

    return ZE_RESULT_ERROR_UNINITIALIZED;    
}